

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsAdvDiff_bnd.c
# Opt level: O0

int f(sunrealtype t,N_Vector u,N_Vector udot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  long in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  UserData data;
  int j;
  int i;
  sunrealtype *dudata;
  sunrealtype *udata;
  sunrealtype vdiff;
  sunrealtype hadv;
  sunrealtype hdiff;
  sunrealtype verdc;
  sunrealtype horac;
  sunrealtype hordc;
  sunrealtype urt;
  sunrealtype ult;
  sunrealtype uup;
  sunrealtype udn;
  sunrealtype uij;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined4 local_90;
  undefined4 local_8c;
  
  lVar5 = N_VGetArrayPointer(in_RDI);
  lVar6 = N_VGetArrayPointer(in_RSI);
  dVar1 = *(double *)(in_RDX + 0x10);
  dVar2 = *(double *)(in_RDX + 0x18);
  dVar3 = *(double *)(in_RDX + 0x20);
  for (local_90 = 1; local_90 < 6; local_90 = local_90 + 1) {
    for (local_8c = 1; local_8c < 0xb; local_8c = local_8c + 1) {
      dVar4 = *(double *)(lVar5 + (long)(local_90 + -1 + (local_8c + -1) * 5) * 8);
      if (local_90 == 1) {
        local_a0 = 0.0;
      }
      else {
        local_a0 = *(double *)(lVar5 + (long)(local_90 + -2 + (local_8c + -1) * 5) * 8);
      }
      if (local_90 == 5) {
        local_a8 = 0.0;
      }
      else {
        local_a8 = *(double *)(lVar5 + (long)(local_90 + (local_8c + -1) * 5) * 8);
      }
      if (local_8c == 1) {
        local_b0 = 0.0;
      }
      else {
        local_b0 = *(double *)(lVar5 + (long)(local_90 + -1 + (local_8c + -2) * 5) * 8);
      }
      if (local_8c == 10) {
        local_b8 = 0.0;
      }
      else {
        local_b8 = *(double *)(lVar5 + (long)(local_90 + -1 + local_8c * 5) * 8);
      }
      *(double *)(lVar6 + (long)(local_90 + -1 + (local_8c + -1) * 5) * 8) =
           dVar1 * ((local_b0 - (dVar4 + dVar4)) + local_b8) + dVar2 * (local_b8 - local_b0) +
           dVar3 * ((local_a8 - (dVar4 + dVar4)) + local_a0);
    }
  }
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector u, N_Vector udot, void* user_data)
{
  sunrealtype uij, udn, uup, ult, urt, hordc, horac, verdc, hdiff, hadv, vdiff;
  sunrealtype *udata, *dudata;
  int i, j;
  UserData data;

  udata  = N_VGetArrayPointer(u);
  dudata = N_VGetArrayPointer(udot);

  /* Extract needed constants from data */

  data  = (UserData)user_data;
  hordc = data->hdcoef;
  horac = data->hacoef;
  verdc = data->vdcoef;

  /* Loop over all grid points. */

  for (j = 1; j <= MY; j++)
  {
    for (i = 1; i <= MX; i++)
    {
      /* Extract u at x_i, y_j and four neighboring points */

      uij = IJth(udata, i, j);
      udn = (j == 1) ? ZERO : IJth(udata, i, j - 1);
      uup = (j == MY) ? ZERO : IJth(udata, i, j + 1);
      ult = (i == 1) ? ZERO : IJth(udata, i - 1, j);
      urt = (i == MX) ? ZERO : IJth(udata, i + 1, j);

      /* Set diffusion and advection terms and load into udot */

      hdiff              = hordc * (ult - TWO * uij + urt);
      hadv               = horac * (urt - ult);
      vdiff              = verdc * (uup - TWO * uij + udn);
      IJth(dudata, i, j) = hdiff + hadv + vdiff;
    }
  }

  return (0);
}